

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O0

void __thiscall re2::Regexp::ParseState::DoAlternation(ParseState *this)

{
  long in_RDI;
  Regexp *r1;
  Regexp *in_stack_00000040;
  RegexpOp in_stack_0000008c;
  ParseState *in_stack_00000090;
  
  DoVerticalBar((ParseState *)r1);
  *(undefined8 *)(in_RDI + 0x20) = *(undefined8 *)(*(long *)(in_RDI + 0x20) + 0x10);
  Decref(in_stack_00000040);
  DoCollapse(in_stack_00000090,in_stack_0000008c);
  return;
}

Assistant:

void Regexp::ParseState::DoAlternation() {
  DoVerticalBar();
  // Now stack top is kVerticalBar.
  Regexp* r1 = stacktop_;
  stacktop_ = r1->down_;
  r1->Decref();
  DoCollapse(kRegexpAlternate);
}